

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

void __thiscall wasm::TypeBuilder::TypeBuilder(TypeBuilder *this,size_t n)

{
  unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_> local_20;
  size_t local_18;
  size_t n_local;
  TypeBuilder *this_local;
  
  local_18 = n;
  n_local = (size_t)this;
  std::unique_ptr<wasm::TypeBuilder::Impl,std::default_delete<wasm::TypeBuilder::Impl>>::
  unique_ptr<std::default_delete<wasm::TypeBuilder::Impl>,void>
            ((unique_ptr<wasm::TypeBuilder::Impl,std::default_delete<wasm::TypeBuilder::Impl>> *)
             this);
  std::make_unique<wasm::TypeBuilder::Impl,unsigned_long&>((unsigned_long *)&local_20);
  std::unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>::operator=
            (&this->impl,&local_20);
  std::unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>::
  ~unique_ptr(&local_20);
  return;
}

Assistant:

TypeBuilder::TypeBuilder(size_t n) {
  impl = std::make_unique<TypeBuilder::Impl>(n);
}